

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O1

WORD32 ihevc_buf_mgr_set_status(buf_mgr_t *ps_buf_mgr,WORD32 buf_id,UWORD32 mask)

{
  WORD32 WVar1;
  uint uVar2;
  
  WVar1 = -1;
  if (buf_id < (int)ps_buf_mgr->u4_max_buf_cnt) {
    if ((ps_buf_mgr->au4_status[buf_id] & mask) == 0) {
      uVar2 = ps_buf_mgr->au4_status[buf_id] | mask;
      ps_buf_mgr->au4_status[buf_id] = uVar2;
      WVar1 = 0;
      if (uVar2 == 2) {
        __assert_fail("(ps_buf_mgr->au4_status[buf_id] != 2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_buf_mgr.c"
                      ,0x142,"WORD32 ihevc_buf_mgr_set_status(buf_mgr_t *, WORD32, UWORD32)");
      }
    }
  }
  return WVar1;
}

Assistant:

WORD32 ihevc_buf_mgr_set_status(
                buf_mgr_t *ps_buf_mgr,
                WORD32 buf_id,
                UWORD32 mask)
{
    if(buf_id >= (WORD32)ps_buf_mgr->u4_max_buf_cnt)
    {
        return (-1);
    }


    if((ps_buf_mgr->au4_status[buf_id] & mask) != 0)
    {
        return (-1);
    }

    ps_buf_mgr->au4_status[buf_id] |= mask;
    ASSERT(ps_buf_mgr->au4_status[buf_id] != 2);
    return 0;
}